

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http(Curl_easy *data,_Bool *done)

{
  size_t sVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  char *local_198;
  char *local_170;
  char *local_160;
  char *local_150;
  char *local_140;
  char *local_130;
  char *local_120;
  char *local_110;
  char *local_100;
  char *local_f0;
  char *local_e0;
  char *local_b8;
  char *pq;
  char *p_accept;
  char *altused;
  dynbuf req;
  char *httpstring;
  char *request;
  char *te;
  anon_union_8_12_57927972_for_p aStack_60;
  Curl_HttpReq httpreq;
  HTTP *http;
  connectdata *pcStack_50;
  CURLcode result;
  connectdata *conn;
  _Bool *done_local;
  Curl_easy *data_local;
  
  pcStack_50 = data->conn;
  request = "";
  p_accept = (char *)0x0;
  *done = true;
  if (pcStack_50->transport != TRNSPRT_QUIC) {
    if (0x13 < pcStack_50->httpversion) {
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    if ((pcStack_50->negnpn != 2) && (pcStack_50->negnpn == 3)) {
      pcStack_50->httpversion = '\x14';
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
  }
  http._4_4_ = 0;
  aStack_60 = (data->req).p;
  conn = (connectdata *)done;
  done_local = (_Bool *)data;
  http._4_4_ = Curl_http_host(data,pcStack_50);
  data_local._4_4_ = http._4_4_;
  if ((http._4_4_ == CURLE_OK) &&
     (http._4_4_ = Curl_http_useragent((Curl_easy *)done_local), data_local._4_4_ = http._4_4_,
     http._4_4_ == CURLE_OK)) {
    Curl_http_method((Curl_easy *)done_local,pcStack_50,&httpstring,(Curl_HttpReq *)((long)&te + 4))
    ;
    local_b8 = (char *)0x0;
    if ((*(long *)(done_local + 0x1288) == 0) ||
       (local_b8 = curl_maprintf("%s?%s",*(undefined8 *)(done_local + 0x1280),
                                 *(undefined8 *)(done_local + 0x1288)), local_b8 != (char *)0x0)) {
      if (local_b8 == (char *)0x0) {
        local_e0 = *(char **)(done_local + 0x1280);
      }
      else {
        local_e0 = local_b8;
      }
      http._4_4_ = Curl_http_output_auth
                             ((Curl_easy *)done_local,pcStack_50,httpstring,te._4_4_,local_e0,false)
      ;
      (*Curl_cfree)(local_b8);
      if (http._4_4_ == CURLE_OK) {
        (*Curl_cfree)(*(void **)(done_local + 0x1310));
        done_local[0x1310] = false;
        done_local[0x1311] = false;
        done_local[0x1312] = false;
        done_local[0x1313] = false;
        done_local[0x1314] = false;
        done_local[0x1315] = false;
        done_local[0x1316] = false;
        done_local[0x1317] = false;
        if ((*(long *)(done_local + 0x12a0) != 0) &&
           (pcVar3 = Curl_checkheaders((Curl_easy *)done_local,"Referer"), pcVar3 == (char *)0x0)) {
          pcVar3 = curl_maprintf("Referer: %s\r\n",*(undefined8 *)(done_local + 0x12a0));
          *(char **)(done_local + 0x1310) = pcVar3;
          if (*(long *)(done_local + 0x1310) == 0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        pcVar3 = Curl_checkheaders((Curl_easy *)done_local,"Accept-Encoding");
        if ((pcVar3 == (char *)0x0) && (*(long *)(done_local + 0x808) != 0)) {
          (*Curl_cfree)(*(void **)(done_local + 0x12f8));
          done_local[0x12f8] = false;
          done_local[0x12f9] = false;
          done_local[0x12fa] = false;
          done_local[0x12fb] = false;
          done_local[0x12fc] = false;
          done_local[0x12fd] = false;
          done_local[0x12fe] = false;
          done_local[0x12ff] = false;
          pcVar3 = curl_maprintf("Accept-Encoding: %s\r\n",*(undefined8 *)(done_local + 0x808));
          *(char **)(done_local + 0x12f8) = pcVar3;
          if (*(long *)(done_local + 0x12f8) == 0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        else {
          (*Curl_cfree)(*(void **)(done_local + 0x12f8));
          done_local[0x12f8] = false;
          done_local[0x12f9] = false;
          done_local[0x12fa] = false;
          done_local[0x12fb] = false;
          done_local[0x12fc] = false;
          done_local[0x12fd] = false;
          done_local[0x12fe] = false;
          done_local[0x12ff] = false;
        }
        http._4_4_ = Curl_transferencode((Curl_easy *)done_local);
        data_local._4_4_ = http._4_4_;
        if ((http._4_4_ == CURLE_OK) &&
           (http._4_4_ = Curl_http_body((Curl_easy *)done_local,pcStack_50,te._4_4_,&request),
           data_local._4_4_ = http._4_4_, http._4_4_ == CURLE_OK)) {
          pcVar3 = Curl_checkheaders((Curl_easy *)done_local,"Accept");
          local_140 = "Accept: */*\r\n";
          if (pcVar3 != (char *)0x0) {
            local_140 = (char *)0x0;
          }
          http._4_4_ = Curl_http_resume((Curl_easy *)done_local,pcStack_50,te._4_4_);
          data_local._4_4_ = http._4_4_;
          if ((http._4_4_ == CURLE_OK) &&
             (http._4_4_ = Curl_http_range((Curl_easy *)done_local,te._4_4_),
             data_local._4_4_ = http._4_4_, http._4_4_ == CURLE_OK)) {
            req.toobig = (size_t)get_http_string((Curl_easy *)done_local,pcStack_50);
            Curl_dyn_init((dynbuf *)&altused,0x100000);
            Curl_dyn_reset((dynbuf *)(done_local + 0xd18));
            http._4_4_ = Curl_dyn_addf((dynbuf *)&altused,"%s ",httpstring);
            if (http._4_4_ == CURLE_OK) {
              http._4_4_ = Curl_http_target((Curl_easy *)done_local,pcStack_50,(dynbuf *)&altused);
            }
            if (http._4_4_ == CURLE_OK) {
              if ((((*(ulong *)&(pcStack_50->bits).field_0x4 >> 7 & 1) == 0) ||
                  (pcVar3 = Curl_checkheaders((Curl_easy *)done_local,"Alt-Used"),
                  pcVar3 != (char *)0x0)) ||
                 (p_accept = curl_maprintf("Alt-Used: %s:%d\r\n",(pcStack_50->conn_to_host).name,
                                           (ulong)(uint)pcStack_50->conn_to_port),
                 p_accept != (char *)0x0)) {
                sVar1 = req.toobig;
                if (*(long *)(done_local + 0x1318) == 0) {
                  local_f0 = "";
                }
                else {
                  local_f0 = *(char **)(done_local + 0x1318);
                }
                if (*(long *)(done_local + 0x12e8) == 0) {
                  local_100 = "";
                }
                else {
                  local_100 = *(char **)(done_local + 0x12e8);
                }
                if (*(long *)(done_local + 0x1300) == 0) {
                  local_110 = "";
                }
                else {
                  local_110 = *(char **)(done_local + 0x1300);
                }
                if (((*(uint *)(done_local + 0x1358) >> 10 & 1) == 0) ||
                   (*(long *)(done_local + 0x1308) == 0)) {
                  local_120 = "";
                }
                else {
                  local_120 = *(char **)(done_local + 0x1308);
                }
                if (((*(long *)(done_local + 0x8f0) == 0) ||
                    (**(char **)(done_local + 0x8f0) == '\0')) ||
                   (*(long *)(done_local + 0x12f0) == 0)) {
                  local_130 = "";
                }
                else {
                  local_130 = *(char **)(done_local + 0x12f0);
                }
                if (local_140 == (char *)0x0) {
                  local_140 = "";
                }
                if (*(long *)(done_local + 0x1330) == 0) {
                  local_150 = "";
                }
                else {
                  local_150 = *(char **)(done_local + 0x1330);
                }
                if (((*(long *)(done_local + 0x808) == 0) ||
                    (**(char **)(done_local + 0x808) == '\0')) ||
                   (*(long *)(done_local + 0x12f8) == 0)) {
                  local_160 = "";
                }
                else {
                  local_160 = *(char **)(done_local + 0x12f8);
                }
                if ((*(long *)(done_local + 0x12a0) == 0) || (*(long *)(done_local + 0x1310) == 0))
                {
                  local_170 = "";
                }
                else {
                  local_170 = *(char **)(done_local + 0x1310);
                }
                bVar4 = false;
                if (((*(ulong *)&(pcStack_50->bits).field_0x4 & 1) != 0) &&
                   (bVar4 = false, (*(ulong *)&(pcStack_50->bits).field_0x4 >> 3 & 1) == 0)) {
                  pcVar3 = Curl_checkheaders((Curl_easy *)done_local,"Proxy-Connection");
                  bVar4 = false;
                  if (pcVar3 == (char *)0x0) {
                    pcVar3 = Curl_checkProxyheaders
                                       ((Curl_easy *)done_local,pcStack_50,"Proxy-Connection");
                    bVar4 = pcVar3 == (char *)0x0;
                  }
                }
                pcVar3 = "";
                if (bVar4) {
                  pcVar3 = "Proxy-Connection: Keep-Alive\r\n";
                }
                if (p_accept == (char *)0x0) {
                  local_198 = "";
                }
                else {
                  local_198 = p_accept;
                }
                http._4_4_ = Curl_dyn_addf((dynbuf *)&altused," HTTP/%s\r\n%s%s%s%s%s%s%s%s%s%s%s%s"
                                           ,sVar1,local_f0,local_100,local_110,local_120,local_130,
                                           local_140,local_150,local_160,local_170,pcVar3,request,
                                           local_198);
                (*Curl_cfree)(*(void **)(done_local + 0x1300));
                done_local[0x1300] = false;
                done_local[0x1301] = false;
                done_local[0x1302] = false;
                done_local[0x1303] = false;
                done_local[0x1304] = false;
                done_local[0x1305] = false;
                done_local[0x1306] = false;
                done_local[0x1307] = false;
                (*Curl_cfree)(*(void **)(done_local + 0x12e8));
                done_local[0x12e8] = false;
                done_local[0x12e9] = false;
                done_local[0x12ea] = false;
                done_local[0x12eb] = false;
                done_local[0x12ec] = false;
                done_local[0x12ed] = false;
                done_local[0x12ee] = false;
                done_local[0x12ef] = false;
                (*Curl_cfree)(p_accept);
                if (http._4_4_ == CURLE_OK) {
                  if ((((pcStack_50->handler->flags & 1) == 0) &&
                      (pcStack_50->httpversion != '\x14')) && (done_local[0x11e0] == true)) {
                    http._4_4_ = CURLE_UNSUPPORTED_PROTOCOL;
                    Curl_dyn_free((dynbuf *)&altused);
                    data_local._4_4_ = http._4_4_;
                  }
                  else {
                    http._4_4_ = Curl_http_cookies((Curl_easy *)done_local,pcStack_50,
                                                   (dynbuf *)&altused);
                    if (http._4_4_ == CURLE_OK) {
                      http._4_4_ = Curl_add_timecondition
                                             ((Curl_easy *)done_local,(dynbuf *)&altused);
                    }
                    if (http._4_4_ == CURLE_OK) {
                      http._4_4_ = Curl_add_custom_headers
                                             ((Curl_easy *)done_local,false,(dynbuf *)&altused);
                    }
                    if (http._4_4_ == CURLE_OK) {
                      (aStack_60.http)->postdata = (char *)0x0;
                      if ((te._4_4_ == HTTPREQ_GET) || (te._4_4_ == HTTPREQ_HEAD)) {
                        Curl_pgrsSetUploadSize((Curl_easy *)done_local,0);
                      }
                      http._4_4_ = Curl_http_bodysend((Curl_easy *)done_local,pcStack_50,
                                                      (dynbuf *)&altused,te._4_4_);
                    }
                    if (http._4_4_ == CURLE_OK) {
                      if (((-1 < (aStack_60.http)->postsize) &&
                          ((aStack_60.http)->postsize <= *(long *)(done_local + 0xe8))) &&
                         ((aStack_60.http)->sending != HTTPSEND_REQUEST)) {
                        *(ushort *)(done_local + 0x1a8) =
                             *(ushort *)(done_local + 0x1a8) & 0xfffb | 4;
                      }
                      if (*(long *)(done_local + 0xe8) != 0) {
                        Curl_pgrsSetUploadCounter
                                  ((Curl_easy *)done_local,*(curl_off_t *)(done_local + 0xe8));
                        iVar2 = Curl_pgrsUpdate((Curl_easy *)done_local);
                        if (iVar2 != 0) {
                          http._4_4_ = CURLE_ABORTED_BY_CALLBACK;
                        }
                        if ((aStack_60.file)->freepath == (char *)0x0) {
                          Curl_infof((Curl_easy *)done_local,
                                     "upload completely sent off: %ld out of %ld bytes",
                                     *(undefined8 *)(done_local + 0xe8),(aStack_60.file)->freepath);
                          *(ushort *)(done_local + 0x1a8) =
                               *(ushort *)(done_local + 0x1a8) & 0xfffb | 4;
                          *(uint *)(done_local + 0x144) = *(uint *)(done_local + 0x144) & 0xfffffffd
                          ;
                          done_local[0x158] = false;
                          done_local[0x159] = false;
                          done_local[0x15a] = false;
                          done_local[0x15b] = false;
                          Curl_expire_done((Curl_easy *)done_local,EXPIRE_100_TIMEOUT);
                        }
                      }
                      if ((pcStack_50->httpversion == '\x14') &&
                         ((*(ushort *)(done_local + 0x1a8) >> 6 & 1) != 0)) {
                        *(ushort *)(done_local + 0x1a8) = *(ushort *)(done_local + 0x1a8) & 0xffbf;
                      }
                      data_local._4_4_ = http._4_4_;
                    }
                    else {
                      Curl_dyn_free((dynbuf *)&altused);
                      data_local._4_4_ = http._4_4_;
                    }
                  }
                }
                else {
                  Curl_dyn_free((dynbuf *)&altused);
                  data_local._4_4_ = http._4_4_;
                }
              }
              else {
                Curl_dyn_free((dynbuf *)&altused);
                data_local._4_4_ = CURLE_OUT_OF_MEMORY;
              }
            }
            else {
              Curl_dyn_free((dynbuf *)&altused);
              data_local._4_4_ = http._4_4_;
            }
          }
        }
      }
      else {
        data_local._4_4_ = http._4_4_;
      }
    }
    else {
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_http(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  CURLcode result = CURLE_OK;
  struct HTTP *http;
  Curl_HttpReq httpreq;
  const char *te = ""; /* transfer-encoding */
  const char *request;
  const char *httpstring;
  struct dynbuf req;
  char *altused = NULL;
  const char *p_accept;      /* Accept: string */

  /* Always consider the DO phase done after this function call, even if there
     may be parts of the request that are not yet sent, since we can deal with
     the rest of the request in the PERFORM phase. */
  *done = TRUE;

  if(conn->transport != TRNSPRT_QUIC) {
    if(conn->httpversion < 20) { /* unless the connection is re-used and
                                    already http2 */
      switch(conn->negnpn) {
      case CURL_HTTP_VERSION_2:
        conn->httpversion = 20; /* we know we're on HTTP/2 now */

        result = Curl_http2_switched(data, NULL, 0);
        if(result)
          return result;
        break;
      case CURL_HTTP_VERSION_1_1:
        /* continue with HTTP/1.1 when explicitly requested */
        break;
      default:
        /* Check if user wants to use HTTP/2 with clear TCP*/
#ifdef USE_NGHTTP2
        if(data->state.httpwant == CURL_HTTP_VERSION_2_PRIOR_KNOWLEDGE) {
#ifndef CURL_DISABLE_PROXY
          if(conn->bits.httpproxy && !conn->bits.tunnel_proxy) {
            /* We don't support HTTP/2 proxies yet. Also it's debatable
               whether or not this setting should apply to HTTP/2 proxies. */
            infof(data, "Ignoring HTTP/2 prior knowledge due to proxy");
            break;
          }
#endif
          DEBUGF(infof(data, "HTTP/2 over clean TCP"));
          conn->httpversion = 20;

          result = Curl_http2_switched(data, NULL, 0);
          if(result)
            return result;
        }
#endif
        break;
      }
    }
    else {
      /* prepare for a http2 request */
      result = Curl_http2_setup(data, conn);
      if(result)
        return result;
    }
  }
  http = data->req.p.http;
  DEBUGASSERT(http);

  result = Curl_http_host(data, conn);
  if(result)
    return result;

  result = Curl_http_useragent(data);
  if(result)
    return result;

  Curl_http_method(data, conn, &request, &httpreq);

  /* setup the authentication headers */
  {
    char *pq = NULL;
    if(data->state.up.query) {
      pq = aprintf("%s?%s", data->state.up.path, data->state.up.query);
      if(!pq)
        return CURLE_OUT_OF_MEMORY;
    }
    result = Curl_http_output_auth(data, conn, request, httpreq,
                                   (pq ? pq : data->state.up.path), FALSE);
    free(pq);
    if(result)
      return result;
  }

  Curl_safefree(data->state.aptr.ref);
  if(data->state.referer && !Curl_checkheaders(data, "Referer")) {
    data->state.aptr.ref = aprintf("Referer: %s\r\n", data->state.referer);
    if(!data->state.aptr.ref)
      return CURLE_OUT_OF_MEMORY;
  }

  if(!Curl_checkheaders(data, "Accept-Encoding") &&
     data->set.str[STRING_ENCODING]) {
    Curl_safefree(data->state.aptr.accept_encoding);
    data->state.aptr.accept_encoding =
      aprintf("Accept-Encoding: %s\r\n", data->set.str[STRING_ENCODING]);
    if(!data->state.aptr.accept_encoding)
      return CURLE_OUT_OF_MEMORY;
  }
  else
    Curl_safefree(data->state.aptr.accept_encoding);

#ifdef HAVE_LIBZ
  /* we only consider transfer-encoding magic if libz support is built-in */
  result = Curl_transferencode(data);
  if(result)
    return result;
#endif

  result = Curl_http_body(data, conn, httpreq, &te);
  if(result)
    return result;

  p_accept = Curl_checkheaders(data, "Accept")?NULL:"Accept: */*\r\n";

  result = Curl_http_resume(data, conn, httpreq);
  if(result)
    return result;

  result = Curl_http_range(data, httpreq);
  if(result)
    return result;

  httpstring = get_http_string(data, conn);

  /* initialize a dynamic send-buffer */
  Curl_dyn_init(&req, DYN_HTTP_REQUEST);

  /* make sure the header buffer is reset - if there are leftovers from a
     previous transfer */
  Curl_dyn_reset(&data->state.headerb);

  /* add the main request stuff */
  /* GET/HEAD/POST/PUT */
  result = Curl_dyn_addf(&req, "%s ", request);
  if(!result)
    result = Curl_http_target(data, conn, &req);
  if(result) {
    Curl_dyn_free(&req);
    return result;
  }

#ifndef CURL_DISABLE_ALTSVC
  if(conn->bits.altused && !Curl_checkheaders(data, "Alt-Used")) {
    altused = aprintf("Alt-Used: %s:%d\r\n",
                      conn->conn_to_host.name, conn->conn_to_port);
    if(!altused) {
      Curl_dyn_free(&req);
      return CURLE_OUT_OF_MEMORY;
    }
  }
#endif
  result =
    Curl_dyn_addf(&req,
                  " HTTP/%s\r\n" /* HTTP version */
                  "%s" /* host */
                  "%s" /* proxyuserpwd */
                  "%s" /* userpwd */
                  "%s" /* range */
                  "%s" /* user agent */
                  "%s" /* accept */
                  "%s" /* TE: */
                  "%s" /* accept-encoding */
                  "%s" /* referer */
                  "%s" /* Proxy-Connection */
                  "%s" /* transfer-encoding */
                  "%s",/* Alt-Used */

                  httpstring,
                  (data->state.aptr.host?data->state.aptr.host:""),
                  data->state.aptr.proxyuserpwd?
                  data->state.aptr.proxyuserpwd:"",
                  data->state.aptr.userpwd?data->state.aptr.userpwd:"",
                  (data->state.use_range && data->state.aptr.rangeline)?
                  data->state.aptr.rangeline:"",
                  (data->set.str[STRING_USERAGENT] &&
                   *data->set.str[STRING_USERAGENT] &&
                   data->state.aptr.uagent)?
                  data->state.aptr.uagent:"",
                  p_accept?p_accept:"",
                  data->state.aptr.te?data->state.aptr.te:"",
                  (data->set.str[STRING_ENCODING] &&
                   *data->set.str[STRING_ENCODING] &&
                   data->state.aptr.accept_encoding)?
                  data->state.aptr.accept_encoding:"",
                  (data->state.referer && data->state.aptr.ref)?
                  data->state.aptr.ref:"" /* Referer: <data> */,
#ifndef CURL_DISABLE_PROXY
                  (conn->bits.httpproxy &&
                   !conn->bits.tunnel_proxy &&
                   !Curl_checkheaders(data, "Proxy-Connection") &&
                   !Curl_checkProxyheaders(data, conn, "Proxy-Connection"))?
                  "Proxy-Connection: Keep-Alive\r\n":"",
#else
                  "",
#endif
                  te,
                  altused ? altused : ""
      );

  /* clear userpwd and proxyuserpwd to avoid re-using old credentials
   * from re-used connections */
  Curl_safefree(data->state.aptr.userpwd);
  Curl_safefree(data->state.aptr.proxyuserpwd);
  free(altused);

  if(result) {
    Curl_dyn_free(&req);
    return result;
  }

  if(!(conn->handler->flags&PROTOPT_SSL) &&
     conn->httpversion != 20 &&
     (data->state.httpwant == CURL_HTTP_VERSION_2)) {
    /* append HTTP2 upgrade magic stuff to the HTTP request if it isn't done
       over SSL */
    result = Curl_http2_request_upgrade(&req, data);
    if(result) {
      Curl_dyn_free(&req);
      return result;
    }
  }

  result = Curl_http_cookies(data, conn, &req);
  if(!result)
    result = Curl_add_timecondition(data, &req);
  if(!result)
    result = Curl_add_custom_headers(data, FALSE, &req);

  if(!result) {
    http->postdata = NULL;  /* nothing to post at this point */
    if((httpreq == HTTPREQ_GET) ||
       (httpreq == HTTPREQ_HEAD))
      Curl_pgrsSetUploadSize(data, 0); /* nothing */

    /* bodysend takes ownership of the 'req' memory on success */
    result = Curl_http_bodysend(data, conn, &req, httpreq);
  }
  if(result) {
    Curl_dyn_free(&req);
    return result;
  }

  if((http->postsize > -1) &&
     (http->postsize <= data->req.writebytecount) &&
     (http->sending != HTTPSEND_REQUEST))
    data->req.upload_done = TRUE;

  if(data->req.writebytecount) {
    /* if a request-body has been sent off, we make sure this progress is noted
       properly */
    Curl_pgrsSetUploadCounter(data, data->req.writebytecount);
    if(Curl_pgrsUpdate(data))
      result = CURLE_ABORTED_BY_CALLBACK;

    if(!http->postsize) {
      /* already sent the entire request body, mark the "upload" as
         complete */
      infof(data, "upload completely sent off: %" CURL_FORMAT_CURL_OFF_T
            " out of %" CURL_FORMAT_CURL_OFF_T " bytes",
            data->req.writebytecount, http->postsize);
      data->req.upload_done = TRUE;
      data->req.keepon &= ~KEEP_SEND; /* we're done writing */
      data->req.exp100 = EXP100_SEND_DATA; /* already sent */
      Curl_expire_done(data, EXPIRE_100_TIMEOUT);
    }
  }

  if((conn->httpversion == 20) && data->req.upload_chunky)
    /* upload_chunky was set above to set up the request in a chunky fashion,
       but is disabled here again to avoid that the chunked encoded version is
       actually used when sending the request body over h2 */
    data->req.upload_chunky = FALSE;
  return result;
}